

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.cpp
# Opt level: O2

uint __thiscall o3dgc::Arithmetic_Codec::decode(Arithmetic_Codec *this,Adaptive_Bit_Model *M)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar2 = this->value;
  uVar4 = (this->length >> 0xd) * M->bit_0_prob;
  if (uVar2 < uVar4) {
    this->length = uVar4;
    M->bit_0_count = M->bit_0_count + 1;
    uVar3 = this->length;
  }
  else {
    this->value = uVar2 - uVar4;
    uVar3 = this->length - uVar4;
    this->length = uVar3;
  }
  if (uVar3 < 0x1000000) {
    renorm_dec_interval(this);
  }
  puVar1 = &M->bits_until_update;
  *puVar1 = *puVar1 - 1;
  if (*puVar1 == 0) {
    Adaptive_Bit_Model::update(M);
  }
  return (uint)(uVar4 <= uVar2);
}

Assistant:

unsigned Arithmetic_Codec::decode(Adaptive_Bit_Model & M)
    {
    #ifdef _DEBUG
      if (mode != 2) AC_Error("decoder not initialized");
    #endif

      unsigned x = M.bit_0_prob * (length >> BM__LengthShift);   // product l x p0
      unsigned bit = (value >= x);                                     // decision
                                                                // update interval
      if (bit == 0) {
        length = x;
        ++M.bit_0_count;
      }
      else {
        value  -= x;
        length -= x;
      }

      if (length < AC__MinLength) renorm_dec_interval();        // renormalization

      if (--M.bits_until_update == 0) M.update();         // periodic model update

      return bit;                                         // return data bit value
    }